

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O2

void GetFileAndPassword(char *nextarg,char **file,char **password)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *__dest;
  
  if (nextarg == (char *)0x0) {
    return;
  }
  sVar5 = strlen(nextarg);
  if (sVar5 == 0) {
LAB_00112d62:
    pcVar6 = (char *)0x0;
  }
  else {
    iVar4 = curl_strnequal(nextarg,"pkcs11:",7);
    if ((iVar4 == 0) && (pcVar6 = strpbrk(nextarg,":\\"), pcVar6 != (char *)0x0)) {
      pcVar6 = (char *)malloc(sVar5 + 1);
      if (pcVar6 != (char *)0x0) {
        pcVar7 = (char *)0x0;
        __dest = pcVar6;
LAB_00112cc9:
        do {
          pcVar8 = __dest;
          if (*nextarg == '\0') goto LAB_00112da8;
          sVar5 = strcspn(nextarg,":\\");
          memcpy(__dest,nextarg,sVar5);
          pcVar1 = nextarg + sVar5;
          pcVar8 = __dest + sVar5;
          pcVar2 = nextarg + sVar5;
          if (*pcVar2 == '\\') {
            cVar3 = pcVar1[1];
            __dest = pcVar8 + 1;
            if (cVar3 == '\\') {
              *pcVar8 = '\\';
            }
            else {
              if (cVar3 != ':') {
                if (cVar3 == '\0') {
                  nextarg = pcVar1 + 1;
                  *pcVar8 = '\\';
                }
                else {
                  *pcVar8 = '\\';
                  pcVar8[1] = cVar3;
                  __dest = pcVar8 + 2;
                  nextarg = pcVar1 + 2;
                }
                goto LAB_00112cc9;
              }
              *pcVar8 = ':';
            }
            nextarg = pcVar1 + 2;
            goto LAB_00112cc9;
          }
          nextarg = pcVar1;
          __dest = pcVar8;
        } while (*pcVar2 != ':');
        if (pcVar1[1] == '\0') {
          pcVar7 = (char *)0x0;
        }
        else {
          pcVar7 = strdup(pcVar1 + 1);
        }
LAB_00112da8:
        *pcVar8 = '\0';
        goto LAB_00112d68;
      }
      goto LAB_00112d62;
    }
    pcVar6 = strdup(nextarg);
  }
  pcVar7 = (char *)0x0;
LAB_00112d68:
  free(*file);
  *file = pcVar6;
  if (pcVar7 != (char *)0x0) {
    free(*password);
    *password = pcVar7;
  }
  return;
}

Assistant:

static void
GetFileAndPassword(const char *nextarg, char **file, char **password)
{
  char *certname, *passphrase;
  if(nextarg) {
    parse_cert_parameter(nextarg, &certname, &passphrase);
    free(*file);
    *file = certname;
    if(passphrase) {
      free(*password);
      *password = passphrase;
    }
  }
}